

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::GetPropertyQuery
          (CustomExternalWrapperObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ScriptContext *scriptContext;
  DynamicObject *aValue;
  code *pcVar3;
  Var *ppvVar4;
  bool bVar5;
  BOOL BVar6;
  PropertyQueryFlags PVar7;
  Attributes attributes;
  JavascriptFunction *function;
  RecyclableObject *pRVar8;
  JavascriptMethod p_Var9;
  undefined4 *puVar10;
  RecyclableObject *this_00;
  char *message;
  char *error;
  ThreadContext *pTVar11;
  uint lineNumber;
  Recycler *this_01;
  PropertyDescriptor *this_02;
  char *fileName;
  PropertyDescriptor local_d8;
  undefined1 local_a8 [8];
  PropertyDescriptor result;
  Var isPropertyNameNumeric;
  Var *local_68;
  Var local_60;
  Var local_58;
  Type local_50;
  Type TStack_4f;
  undefined6 uStack_4e;
  Var local_48;
  ThreadContext *local_40;
  bool local_31;
  
  local_60 = originalInstance;
  BVar6 = VerifyObjectAlive(this);
  if (BVar6 == 0) {
    return Property_NotFound;
  }
  local_68 = value;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  local_40 = requestContext->threadContext;
  BVar6 = EnsureInitialized(this,requestContext);
  if (BVar6 != 0) {
    aValue = ((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.ptr)->
             elements[0].prototypeObjectWithProperty.ptr;
    if ((aValue == (DynamicObject *)0x0) ||
       (function = VarTo<Js::JavascriptFunction>(aValue), function == (JavascriptFunction *)0x0)) {
LAB_00b31c8a:
      ppvVar4 = local_68;
      PVar7 = DynamicObject::GetPropertyQuery
                        (&this->super_DynamicObject,local_60,propertyId,local_68,info,requestContext
                        );
      bVar5 = PVar7 == Property_Found;
      PropertyDescriptor::SetValue((PropertyDescriptor *)local_a8,*ppvVar4);
    }
    else {
      this_01 = requestContext->recycler;
      bVar5 = Memory::Recycler::IsHeapEnumInProgress(this_01);
      if (bVar5) goto LAB_00b31c8a;
      local_58 = GetName((CustomExternalWrapperObject *)this_01,requestContext,propertyId,
                         (Var *)&result.Configurable,&isPropertyNameNumeric);
      pTVar11 = local_40;
      if (info != (PropertyValueInfo *)0x0) {
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
      }
      local_50 = result.Configurable;
      TStack_4f = result.fromProxy;
      uStack_4e = result._42_6_;
      local_48 = isPropertyNameNumeric;
      local_31 = local_40->reentrancySafeOrHandled;
      local_40->reentrancySafeOrHandled = true;
      attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
      bVar5 = ThreadContext::HasNoSideEffect(pTVar11,(RecyclableObject *)function,attributes);
      pTVar11 = local_40;
      if (bVar5) {
        ThreadContext::CheckAndResetReentrancySafeOrHandled(local_40);
        if (pTVar11->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        CheckIsExecutable((RecyclableObject *)function,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        pRVar8 = (RecyclableObject *)
                 (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,
                           0x2000004,this,local_58,_local_50,local_48);
        bVar5 = ThreadContext::IsOnStack(pRVar8);
LAB_00b31df8:
        if (bVar5 != false) {
          pTVar11->implicitCallFlags = pTVar11->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((local_40->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
      {
        if ((attributes & HasNoSideEffect) != None) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(local_40);
          if (pTVar11->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
          CheckIsExecutable((RecyclableObject *)function,p_Var9);
          p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
          pRVar8 = (RecyclableObject *)
                   (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,
                             0x2000004,this,local_58,_local_50,local_48);
          bVar5 = ThreadContext::IsOnStack(pRVar8);
          goto LAB_00b31df8;
        }
        IVar1 = local_40->implicitCallFlags;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(local_40);
        if (local_40->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        CheckIsExecutable((RecyclableObject *)function,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        pRVar8 = (RecyclableObject *)
                 (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,
                           0x2000004,this,local_58,_local_50,local_48);
        local_40->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        pTVar11 = local_40;
      }
      else {
        local_40->implicitCallFlags = local_40->implicitCallFlags | ImplicitCall_Accessor;
        pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                   super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                 undefinedValue.ptr;
      }
      pTVar11->reentrancySafeOrHandled = local_31;
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00b32130;
        *puVar10 = 0;
LAB_00b31fcb:
        this_00 = UnsafeVarTo<Js::RecyclableObject>(pRVar8);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar5) goto LAB_00b32130;
          *puVar10 = 0;
        }
        TVar2 = ((this_00->type).ptr)->typeId;
        if (0x57 < (int)TVar2) {
          BVar6 = RecyclableObject::IsExternal(this_00);
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            fileName = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
            ;
            error = "(typeId < TypeIds_Limit || obj->IsExternal())";
            message = "GetTypeId aValue has invalid TypeId";
            lineNumber = 0xe;
            goto LAB_00b32094;
          }
          goto LAB_00b320a7;
        }
        if (TVar2 != TypeIds_Undefined) goto LAB_00b320a7;
        bVar5 = false;
      }
      else {
        if (((ulong)pRVar8 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)pRVar8 & 0xffff000000000000) != 0x1000000000000) {
          if ((ulong)pRVar8 >> 0x32 == 0 && ((ulong)pRVar8 & 0xffff000000000000) != 0x1000000000000)
          goto LAB_00b31fcb;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          fileName = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
          ;
          error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
          message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
          lineNumber = 0x2a;
LAB_00b32094:
          bVar5 = Throw::ReportAssert(fileName,lineNumber,error,message);
          if (!bVar5) {
LAB_00b32130:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar10 = 0;
        }
LAB_00b320a7:
        PropertyDescriptor::SetValue((PropertyDescriptor *)local_a8,pRVar8);
        bVar5 = true;
      }
    }
    if (bVar5) {
      this_02 = &local_d8;
      PropertyDescriptor::PropertyDescriptor(&local_d8,(PropertyDescriptor *)local_a8);
      pRVar8 = (RecyclableObject *)
               GetValueFromDescriptor
                         ((CustomExternalWrapperObject *)this_02,local_60,&local_d8,requestContext);
      PVar7 = Property_Found;
      goto LAB_00b31cf6;
    }
  }
  pRVar8 = ScriptContext::GetMissingPropertyResult(requestContext);
  PVar7 = Property_NotFound;
LAB_00b31cf6:
  *local_68 = pRVar8;
  return PVar7;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::GetPropertyQuery(Js::Var originalInstance, Js::PropertyId propertyId, Js::Var* value, Js::PropertyValueInfo* info, Js::ScriptContext* requestContext)
{
    if (!this->VerifyObjectAlive()) return Js::PropertyQueryFlags::Property_NotFound;
    Js::PropertyDescriptor result;

    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        BOOL found = JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext));
        result.SetValue(*value);
        return found;
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyName, requestContext, info);
    if (!foundProperty)
    {
        *value = requestContext->GetMissingPropertyResult();
    }
    else
    {
        *value = GetValueFromDescriptor(originalInstance, result, requestContext);
    }
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
}